

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O2

PolyNf * __thiscall
Inferences::PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (PolyNf *__return_storage_ptr__,PolynomialEvaluation *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *summands,
          bool removeZeros)

{
  int iVar1;
  Entry *pEVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar6;
  bool bVar7;
  undefined7 in_register_00000009;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  ulong uVar8;
  int local_118;
  char local_114;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> monom;
  IntegerConstantType local_d8;
  uint local_c8 [4];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_b8;
  IntegerConstantType local_a8;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_98;
  Numeral numeral;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_68;
  AnyPoly local_48;
  
  std::
  __sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->_memo)._memo._entries,(this->_memo)._memo._afterLast,summands,
             CONCAT71(in_register_00000009,removeZeros));
  local_118 = 0;
  uVar8 = 0;
  __length = extraout_RDX;
  do {
    pEVar2 = (this->_memo)._memo._entries;
    if ((ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar2 >> 5) <= uVar8) {
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::truncate
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this,
                 (char *)(long)local_118,__length);
      pEVar2 = (this->_memo)._memo._entries;
      if ((long)(this->_memo)._memo._afterLast - (long)pEVar2 == 0x20) {
        Kernel::IntegerConstantType::IntegerConstantType(&local_d8,(IntegerConstantType *)pEVar2);
        monom.numeral._val[0]._mp_alloc = 1;
        bVar7 = Kernel::operator==(&local_d8,(int *)&monom);
        if ((bVar7) &&
           (lVar3 = *(long *)((long)&((this->_memo)._memo._entries)->_key + 0x14),
           lVar4 = *(long *)(lVar3 + 8), (int)((*(long *)(lVar3 + 0x10) - lVar4) / 0x1c) == 1)) {
          iVar1 = *(int *)(lVar4 + 0x18);
          Kernel::IntegerConstantType::~IntegerConstantType(&local_d8);
          if (iVar1 == 1) {
            Lib::CoproductImpl::TrivialOperations::CopyCons::
            DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
            ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)__return_storage_ptr__,
                          *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                            **)(*(long *)((long)&((this->_memo)._memo._entries)->_key + 0x14) + 8));
            return __return_storage_ptr__;
          }
        }
        else {
          Kernel::IntegerConstantType::~IntegerConstantType(&local_d8);
        }
      }
      Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
                ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&monom,
                 (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
                (&local_68,
                 (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)&monom);
      Lib::
      perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)local_c8,
                 (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&local_68);
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[7] = '\0';
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._0_8_ = (ulong)local_c8[0] << 8;
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._8_7_ = SUB87(local_c8._8_8_,0);
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[0xf] = SUB81(local_c8._8_8_,7);
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._17_3_ = 0;
      Kernel::PolyNf::PolyNf(__return_storage_ptr__,&local_48);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack(&local_68)
      ;
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)&monom);
      return __return_storage_ptr__;
    }
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
              (&monom,(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                      (&pEVar2->code + uVar8 * 8));
    Kernel::IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)numeral._val,&monom.numeral);
    pMVar6 = monom.factors._ptr;
    uVar5 = monom.factors._id;
    while( true ) {
      uVar8 = (ulong)((int)uVar8 + 1);
      pEVar2 = (this->_memo)._memo._entries;
      if (((ulong)((long)(this->_memo)._memo._afterLast - (long)pEVar2 >> 5) <= uVar8) ||
         (*(uint *)((long)&pEVar2->_key + uVar8 * 0x20 + 0xc) != uVar5)) break;
      Kernel::IntegerConstantType::operator+(&local_98.numeral,(IntegerConstantType *)numeral._val);
      mpz_swap(numeral._val,(__mpz_struct *)&local_98);
      Kernel::IntegerConstantType::~IntegerConstantType(&local_98.numeral);
    }
    local_114 = (char)summands;
    if (local_114 == '\0') {
LAB_0040a921:
      Kernel::IntegerConstantType::IntegerConstantType
                (&local_a8,(IntegerConstantType *)numeral._val);
      local_b8._id = uVar5;
      local_b8._ptr = pMVar6;
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
                (&local_98,&local_a8,&local_b8);
      Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::operator=
                ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 (&((this->_memo)._memo._entries)->code + (long)local_118 * 8),&local_98);
      local_118 = local_118 + 1;
      Kernel::IntegerConstantType::~IntegerConstantType(&local_98.numeral);
      Kernel::IntegerConstantType::~IntegerConstantType(&local_a8);
    }
    else {
      Kernel::IntegerConstantType::IntegerConstantType(&local_98.numeral,0);
      bVar7 = Kernel::operator!=((IntegerConstantType *)numeral._val,&local_98.numeral);
      Kernel::IntegerConstantType::~IntegerConstantType(&local_98.numeral);
      if (bVar7) goto LAB_0040a921;
    }
    Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)numeral._val);
    Kernel::IntegerConstantType::~IntegerConstantType(&monom.numeral);
    __length = extraout_RDX_00;
  } while( true );
}

Assistant:

PolyNf PolynomialEvaluation::simplifySummation(Stack<Monom<Number>> summands, bool removeZeros)
{ 
  using Monom   = Monom<Number>;
  using Polynom = Polynom<Number>;

  // then we sort them by their monom, in order to add up the coefficients efficiently
  std::sort(summands.begin(), summands.end());

  // add up the coefficients (in place)
  {
    auto offs = 0;
    for (unsigned i = 0; i < summands.size(); i++) { 
      auto monom = summands[i];
      auto numeral = monom.numeral;
      auto factors = monom.factors;
      while ( i + 1 < summands.size() && summands[i+1].factors == factors ) {
        numeral = numeral + summands[i+1].numeral;
        i++;
      }
      if (!removeZeros || numeral != Number::constant(0)) 
        summands[offs++] = Monom(numeral, factors);
    }
    summands.truncate(offs);
  }

  if (summands.size() == 1 
      && summands[0].numeral == 1
      && summands[0].factors->nFactors() == 1
      && summands[0].factors->factorAt(0).power == 1
      ) {
    return summands[0].factors->factorAt(0).term;
  } else {
    auto poly = Polynom(std::move(summands));
    poly.integrity();
    return PolyNf(AnyPoly(perfect(std::move(poly))));
  }
}